

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-functions.cpp
# Opt level: O0

size_t arangodb::velocypack::anon_unknown_0::JSONSkipWhiteSpaceC(uint8_t *src,size_t limit)

{
  bool bVar1;
  uint8_t *end;
  size_t limit_local;
  uint8_t *src_local;
  
  src_local = src;
  while( true ) {
    bVar1 = false;
    if ((((src_local < src + limit) && (bVar1 = true, *src_local != ' ')) &&
        (bVar1 = true, *src_local != '\t')) && (bVar1 = true, *src_local != '\n')) {
      bVar1 = *src_local == '\r';
    }
    if (!bVar1) break;
    src_local = src_local + 1;
  }
  return limit - ((long)(src + limit) - (long)src_local);
}

Assistant:

inline std::size_t JSONSkipWhiteSpaceC(uint8_t const* src, std::size_t limit) {
  // Skip up to limit uint8_t from src as long as they are whitespace.
  // Advance ptr and return the number of skipped bytes.
  uint8_t const* end = src + limit;
  while (src < end &&
         (*src == ' ' || *src == '\t' || *src == '\n' || *src == '\r')) {
    src++;
  }
  return limit - (end - src);
}